

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::_::
CopyConstructArray_<capnp::compiler::CompilerMain::OutputDirective,_capnp::compiler::CompilerMain::OutputDirective_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  OutputDirective *pOVar1;
  ExceptionGuard *this_local;
  
  while (this->start < this->pos) {
    pOVar1 = this->pos;
    this->pos = pOVar1 + -1;
    dtor<capnp::compiler::CompilerMain::OutputDirective>(pOVar1 + -1);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }